

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::FunctionBody::CanInlineRecursively(FunctionBody *this,uint depth,bool tryAggressive)

{
  uint uVar1;
  uint uVar2;
  ProfileId PVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [16];
  uint local_5c;
  uint local_38;
  uint maxDepth;
  uint numberOfAllowedFuncs;
  uint maxRecursiveBytecodeBudget;
  uint maxRecursiveInlineDepth;
  uint minRecursiveInlineDepth;
  uint recursiveInlineSpan;
  bool tryAggressive_local;
  uint depth_local;
  FunctionBody *this_local;
  
  uVar4 = GetNumberOfRecursiveCallSites(this);
  uVar1 = DAT_01eace3c;
  PVar3 = GetProfiledCallSiteCount(this);
  uVar2 = DAT_01eace38;
  local_38 = DAT_01eace34;
  if ((uVar4 == PVar3) && (tryAggressive)) {
    uVar5 = GetByteCodeWithoutLDACount(this);
    local_38 = local_38 / uVar5;
    if (uVar4 != 1) {
      dVar6 = log((double)uVar4);
      auVar7._0_8_ = log((double)local_38 / dVar6);
      auVar7._8_8_ = extraout_XMM0_Qb;
      auVar7 = roundsd(auVar7,auVar7,10);
      local_38 = (uint)(long)auVar7._0_8_;
    }
    if (local_38 < uVar1) {
      local_5c = uVar1;
    }
    else {
      local_5c = local_38;
    }
    uVar1 = uVar2;
    if (local_5c < uVar2) {
      uVar1 = local_5c;
    }
  }
  this_local._7_1_ = depth < uVar1;
  return this_local._7_1_;
}

Assistant:

bool FunctionBody::CanInlineRecursively(uint depth, bool tryAggressive)
    {
        uint recursiveInlineSpan = this->GetNumberOfRecursiveCallSites();

        uint minRecursiveInlineDepth = (uint)CONFIG_FLAG(RecursiveInlineDepthMin);

        if (recursiveInlineSpan != this->GetProfiledCallSiteCount() || tryAggressive == false)
        {
            return depth < minRecursiveInlineDepth;
        }

        uint maxRecursiveInlineDepth = (uint)CONFIG_FLAG(RecursiveInlineDepthMax);
        uint maxRecursiveBytecodeBudget = (uint)CONFIG_FLAG(RecursiveInlineThreshold);
        uint numberOfAllowedFuncs = maxRecursiveBytecodeBudget / this->GetByteCodeWithoutLDACount();
        uint maxDepth;

        if (recursiveInlineSpan == 1)
        {
            maxDepth = numberOfAllowedFuncs;
        }
        else
        {
            maxDepth = (uint)ceil(log((double)((double)numberOfAllowedFuncs) / log((double)recursiveInlineSpan)));
        }
        maxDepth = maxDepth < minRecursiveInlineDepth ? minRecursiveInlineDepth : maxDepth;
        maxDepth = maxDepth < maxRecursiveInlineDepth ? maxDepth : maxRecursiveInlineDepth;
        return depth < maxDepth;
    }